

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DifferentialTest.h
# Opt level: O3

void DiffTestRecurse<Blob<256>,Blob<128>>
               (pfHash hash,Blob<256> *k1,Blob<256> *k2,Blob<128> *h1,Blob<128> *h2,int start,
               int bitsleft,vector<Blob<256>,_std::allocator<Blob<256>_>_> *diffs)

{
  uint32_t start_00;
  ulong uVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  Blob<256> t;
  
  if (start < 0x100) {
    do {
      flipbit(k2,0x20,start);
      (*hash)(k2,0x20,0,h2);
      if (h1->bytes[0] == h2->bytes[0]) {
        uVar4 = 0xffffffffffffffff;
        do {
          if (uVar4 == 0xe) goto LAB_00138c45;
          lVar2 = uVar4 + 2;
          uVar1 = uVar4 + 1;
          lVar3 = uVar4 + 2;
          uVar4 = uVar1;
        } while (h1->bytes[lVar2] == h2->bytes[lVar3]);
        if (0xe < uVar1) {
LAB_00138c45:
          uVar5 = *(uint *)k2->bytes ^ *(uint *)k1->bytes;
          uVar6 = *(uint *)(k2->bytes + 4) ^ *(uint *)(k1->bytes + 4);
          uVar7 = *(uint *)(k2->bytes + 8) ^ *(uint *)(k1->bytes + 8);
          uVar8 = *(uint *)(k2->bytes + 0xc) ^ *(uint *)(k1->bytes + 0xc);
          uVar9 = *(uint *)(k2->bytes + 0x10) ^ *(uint *)(k1->bytes + 0x10);
          uVar10 = *(uint *)(k2->bytes + 0x14) ^ *(uint *)(k1->bytes + 0x14);
          uVar11 = *(uint *)(k2->bytes + 0x18) ^ *(uint *)(k1->bytes + 0x18);
          uVar12 = *(uint *)(k2->bytes + 0x1c) ^ *(uint *)(k1->bytes + 0x1c);
          t.bytes[4] = (char)uVar6;
          t.bytes[5] = (char)(uVar6 >> 8);
          t.bytes[6] = (char)(uVar6 >> 0x10);
          t.bytes[7] = (char)(uVar6 >> 0x18);
          t.bytes[0] = (char)uVar5;
          t.bytes[1] = (char)(uVar5 >> 8);
          t.bytes[2] = (char)(uVar5 >> 0x10);
          t.bytes[3] = (char)(uVar5 >> 0x18);
          t.bytes[0xc] = (char)uVar8;
          t.bytes[0xd] = (char)(uVar8 >> 8);
          t.bytes[0xe] = (char)(uVar8 >> 0x10);
          t.bytes[0xf] = (char)(uVar8 >> 0x18);
          t.bytes[8] = (char)uVar7;
          t.bytes[9] = (char)(uVar7 >> 8);
          t.bytes[10] = (char)(uVar7 >> 0x10);
          t.bytes[0xb] = (char)(uVar7 >> 0x18);
          t.bytes[0x14] = (char)uVar10;
          t.bytes[0x15] = (char)(uVar10 >> 8);
          t.bytes[0x16] = (char)(uVar10 >> 0x10);
          t.bytes[0x17] = (char)(uVar10 >> 0x18);
          t.bytes[0x10] = (char)uVar9;
          t.bytes[0x11] = (char)(uVar9 >> 8);
          t.bytes[0x12] = (char)(uVar9 >> 0x10);
          t.bytes[0x13] = (char)(uVar9 >> 0x18);
          t.bytes[0x1c] = (char)uVar12;
          t.bytes[0x1d] = (char)(uVar12 >> 8);
          t.bytes[0x1e] = (char)(uVar12 >> 0x10);
          t.bytes[0x1f] = (char)(uVar12 >> 0x18);
          t.bytes[0x18] = (char)uVar11;
          t.bytes[0x19] = (char)(uVar11 >> 8);
          t.bytes[0x1a] = (char)(uVar11 >> 0x10);
          t.bytes[0x1b] = (char)(uVar11 >> 0x18);
          std::vector<Blob<256>,std::allocator<Blob<256>>>::emplace_back<Blob<256>>
                    ((vector<Blob<256>,std::allocator<Blob<256>>> *)diffs,&t);
        }
      }
      start_00 = start + 1;
      if (bitsleft + -1 != 0) {
        DiffTestRecurse<Blob<256>,Blob<128>>(hash,k1,k2,h1,h2,start_00,bitsleft + -1,diffs);
      }
      flipbit(k2,0x20,start);
      start = start_00;
    } while (start_00 != 0x100);
  }
  return;
}

Assistant:

void DiffTestRecurse ( pfHash hash, keytype & k1, keytype & k2, hashtype & h1, hashtype & h2, int start, int bitsleft, std::vector<keytype> & diffs )
{
  const int bits = sizeof(keytype)*8;

  for(int i = start; i < bits; i++)
  {
    flipbit(&k2,sizeof(k2),i);
    bitsleft--;

    hash(&k2,sizeof(k2),0,&h2);

    if(h1 == h2)
    {
      diffs.push_back(k1 ^ k2);
    }

    if(bitsleft)
    {
      DiffTestRecurse(hash,k1,k2,h1,h2,i+1,bitsleft,diffs);
    }

    flipbit(&k2,sizeof(k2),i);
    bitsleft++;
  }
}